

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void __thiscall
GEO::AdaptiveKdTree::plane_split
          (AdaptiveKdTree *this,index_t b_in,index_t e_in,coord_index_t coord,double val,
          index_t *br1_out,index_t *br2_out)

{
  double *pdVar1;
  pointer puVar2;
  double *pdVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined7 in_register_00000009;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  index_t iVar10;
  uint uVar11;
  
  uVar11 = e_in - 1;
  puVar2 = (this->super_KdTree).point_index_.
           super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar5 = (int)CONCAT71(in_register_00000009,coord);
  uVar6 = iVar5 << 3;
  pdVar3 = (this->super_KdTree).super_NearestNeighborSearch.points_;
  uVar7 = uVar11;
  do {
    uVar9 = (ulong)uVar7;
    if ((int)b_in < (int)e_in) {
      iVar10 = b_in;
      do {
        b_in = iVar10;
        pdVar1 = (double *)
                 ((long)pdVar3 +
                 (ulong)(puVar2[b_in] * (this->super_KdTree).super_NearestNeighborSearch.stride_) *
                 8 + (ulong)uVar6);
        if (val < *pdVar1 || val == *pdVar1) break;
        iVar10 = b_in + 1;
        b_in = e_in;
      } while (e_in != iVar10);
    }
    if (-1 < (int)uVar7) {
      do {
        if (*(double *)
             ((long)pdVar3 +
             (ulong)(puVar2[uVar9] * (this->super_KdTree).super_NearestNeighborSearch.stride_) * 8 +
             (ulong)uVar6) < val) goto LAB_0015f04c;
        bVar4 = 0 < (long)uVar9;
        uVar9 = uVar9 - 1;
      } while (bVar4);
      uVar9 = 0xffffffff;
    }
LAB_0015f04c:
    if ((int)uVar9 < (int)b_in) {
      puVar2 = (this->super_KdTree).point_index_.
               super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
               super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar6 = iVar5 << 3;
      pdVar3 = (this->super_KdTree).super_NearestNeighborSearch.points_;
      uVar7 = b_in;
      do {
        uVar8 = uVar7;
        if ((int)uVar7 < (int)e_in) {
          do {
            uVar8 = uVar7;
            if (val < *(double *)
                       ((long)pdVar3 +
                       (ulong)(puVar2[uVar7] *
                              (this->super_KdTree).super_NearestNeighborSearch.stride_) * 8 +
                       (ulong)uVar6)) break;
            uVar7 = uVar7 + 1;
            uVar8 = e_in;
          } while (e_in != uVar7);
        }
        if ((int)b_in <= (int)uVar11) {
          uVar7 = uVar11;
          do {
            uVar11 = uVar7;
            if (*(double *)
                 ((long)pdVar3 +
                 (ulong)(puVar2[uVar7] * (this->super_KdTree).super_NearestNeighborSearch.stride_) *
                 8 + (ulong)uVar6) <= val) break;
            bVar4 = (int)b_in < (int)uVar7;
            uVar11 = b_in - 1;
            uVar7 = uVar7 - 1;
          } while (bVar4);
        }
        if ((int)uVar11 < (int)uVar8) {
          *br1_out = b_in;
          *br2_out = uVar8;
          return;
        }
        uVar7 = puVar2[uVar8];
        puVar2[uVar8] = puVar2[uVar11];
        puVar2[uVar11] = uVar7;
        uVar7 = uVar8 + 1;
        uVar11 = uVar11 - 1;
      } while( true );
    }
    uVar7 = puVar2[b_in];
    puVar2[b_in] = puVar2[uVar9 & 0xffffffff];
    puVar2[uVar9 & 0xffffffff] = uVar7;
    b_in = b_in + 1;
    uVar7 = (int)uVar9 - 1;
  } while( true );
}

Assistant:

void AdaptiveKdTree::plane_split(
	index_t b_in, index_t e_in, coord_index_t coord, double val,
	index_t& br1_out, index_t& br2_out
    ) {
	int b = int(b_in);
	int e = int(e_in);
	int l=b;
	int r=e-1;
	while(true) {
	    while(l < e && point_coord(l,coord) < val) {
		++l;
	    }
	    while(r >= 0 && point_coord(r,coord) >= val) {
		--r;
	    }
	    if(l > r) {
		break;
	    }
	    std::swap(point_index_[l], point_index_[r]);
	    ++l; --r;
	}
	int br1 = l;
	r = e-1;
	while(true) {
	    while(l < e && point_coord(l,coord) <= val) {
		++l;
	    }
	    while(r >= br1 && point_coord(r,coord) > val) {
		--r;
	    }
	    if(l > r) {
		break;
	    }
	    std::swap(point_index_[l], point_index_[r]);
	    ++l; --r;
	}
	int br2 = l;
	br1_out = index_t(br1);
	br2_out = index_t(br2);
    }